

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inv_translator_app.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  istream *piVar1;
  ostream *poVar2;
  ulong uVar3;
  long lVar4;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  words;
  string local_238;
  string line;
  string word;
  InverseTranslator InvTranslator;
  istringstream str;
  
  InverseTranslator::InverseTranslator(&InvTranslator);
  words.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  words.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  words.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  line._M_dataplus._M_p = (pointer)&line.field_2;
  line._M_string_length = 0;
  line.field_2._M_local_buf[0] = '\0';
  std::getline<char,std::char_traits<char>,std::allocator<char>>
            ((istream *)&std::cin,(string *)&line);
  std::__cxx11::istringstream::istringstream((istringstream *)&str,(string *)&line,_S_in);
  word._M_dataplus._M_p = (pointer)&word.field_2;
  word._M_string_length = 0;
  word.field_2._M_local_buf[0] = '\0';
  while( true ) {
    piVar1 = std::operator>>((istream *)&str,(string *)&word);
    if (((byte)piVar1[*(long *)(*(long *)piVar1 + -0x18) + 0x20] & 5) != 0) break;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&words,&word);
  }
  lVar4 = 0;
  uVar3 = 0;
  while( true ) {
    if (((long)words.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish -
         (long)words.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start >> 5) - 1U <= uVar3) break;
    InverseTranslator::translate
              (&local_238,&InvTranslator,
               (string *)
               ((long)&((words.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + lVar4));
    poVar2 = std::operator<<((ostream *)&std::cout,(string *)&local_238);
    std::operator<<(poVar2," ");
    std::__cxx11::string::~string((string *)&local_238);
    uVar3 = uVar3 + 1;
    lVar4 = lVar4 + 0x20;
  }
  if (words.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      words.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    InverseTranslator::translate
              (&local_238,&InvTranslator,
               words.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish + -1);
    std::operator<<((ostream *)&std::cout,(string *)&local_238);
    std::__cxx11::string::~string((string *)&local_238);
  }
  std::operator<<((ostream *)&std::cout,'\n');
  std::__cxx11::string::~string((string *)&word);
  std::__cxx11::istringstream::~istringstream((istringstream *)&str);
  std::__cxx11::string::~string((string *)&line);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&words);
  InverseTranslator::~InverseTranslator(&InvTranslator);
  return 0;
}

Assistant:

int main(int argc, char** argv){

    InverseTranslator InvTranslator;
    std::vector<std::string> words;
    
    std::string line;
    getline(std::cin, line);
    
    std::istringstream str(line);
    std::string word;
        
    while( str >> word ) {
      words.push_back(word);
    }
      
    for(int n = 0; n < words.size()-1; n++) {
        std::cout << InvTranslator.translate(words[n]) << " ";
    }

    if (!words.empty()) {
        std::cout << InvTranslator.translate(words.back());
    }
    std::cout << '\n';

    return 0;
}